

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::anon_unknown_0::PluginName
          (string *__return_storage_ptr__,anon_unknown_0 *this,string *plugin_prefix,
          string *directive)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  pointer *local_60;
  long local_58;
  pointer local_50 [2];
  string *local_40;
  long local_38;
  _Alloc_hider local_30;
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,this,this + (long)&plugin_prefix->_M_dataplus);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)directive);
  pcVar5 = (pointer)0xf;
  if (local_60 != local_50) {
    pcVar5 = local_50[0];
  }
  if (pcVar5 < (pointer)(local_38 + local_58)) {
    _Var6._M_p = (pointer)0xf;
    if (local_40 != (string *)&local_30) {
      _Var6._M_p = local_30._M_p;
    }
    if ((pointer)(local_38 + local_58) <= _Var6._M_p) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
      goto LAB_00207bae;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
LAB_00207bae:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  psVar4 = (string *)&local_30;
  if (local_40 != psVar4) {
    operator_delete(local_40,(ulong)(local_30._M_p + 1));
    psVar4 = extraout_RAX;
  }
  if (local_60 != local_50) {
    operator_delete(local_60,(ulong)(local_50[0] + 1));
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

string PluginName(const string& plugin_prefix, const string& directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return plugin_prefix + "gen-" + directive.substr(2, directive.size() - 6);
}